

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

Gia_Man_t * Jf_ManDeriveGia(Jf_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  undefined8 uVar6;
  word *pwVar7;
  Vec_Mem_t *pVVar8;
  word *pwVar9;
  int iVar10;
  int *__ptr;
  undefined4 *__s;
  Vec_Int_t *vCover;
  int *piVar11;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  size_t sVar12;
  char *pcVar13;
  Vec_Int_t *pVVar14;
  Gia_Obj_t *pGVar15;
  Gia_Man_t *pGVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  word uTruth;
  word Truth [4];
  word *local_88;
  word local_68;
  ulong local_60;
  word local_58 [5];
  
  pGVar16 = p->pGia;
  iVar1 = pGVar16->nObjs;
  __ptr = (int *)malloc(0x10);
  iVar17 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar17 = iVar1;
  }
  __ptr[1] = 0;
  *__ptr = iVar17;
  if (iVar17 == 0) {
    __s = (undefined4 *)0x0;
  }
  else {
    __s = (undefined4 *)malloc((long)iVar17 << 2);
  }
  *(undefined4 **)(__ptr + 2) = __s;
  __ptr[1] = iVar1;
  memset(__s,0xff,(long)iVar1 << 2);
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar11 = (int *)malloc(0x40000);
  vCover->pArray = piVar11;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar11 = (int *)malloc(0x40);
  p_00->pArray = piVar11;
  iVar17 = p->pPars->nLutSize;
  uVar3 = 1 << ((char)iVar17 - 6U & 0x1f);
  if (iVar17 < 7) {
    uVar3 = 1;
  }
  local_68 = 0;
  p_01 = Gia_ManStart(pGVar16->nObjs);
  pGVar16 = p->pGia;
  pcVar4 = pGVar16->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar4);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar4);
  }
  p_01->pName = pcVar13;
  pcVar4 = pGVar16->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar4);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar4);
  }
  p_01->pSpec = pcVar13;
  iVar17 = pGVar16->nObjs * 6;
  iVar10 = iVar17 >> 0x1f;
  iVar17 = iVar17 / 5 + iVar10;
  iVar21 = (iVar17 - iVar10) + 100;
  pVVar14 = (Vec_Int_t *)malloc(0x10);
  iVar18 = 0x10;
  if (0xe < (iVar17 - iVar10) + 99U) {
    iVar18 = iVar21;
  }
  pVVar14->nSize = 0;
  pVVar14->nCap = iVar18;
  if (iVar18 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar18 << 2);
  }
  pVVar14->pArray = piVar11;
  pVVar14->nSize = iVar21;
  memset(piVar11,0,(long)iVar21 << 2);
  p_01->vLevels = pVVar14;
  if (iVar1 < 1) {
LAB_00704adf:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *__s = 0;
  pGVar16 = p->pGia;
  pVVar14 = pGVar16->vCis;
  if (0 < pVVar14->nSize) {
    lVar23 = 0;
    do {
      iVar17 = pVVar14->pArray[lVar23];
      if (((long)iVar17 < 0) || (pGVar16->nObjs <= iVar17)) goto LAB_00704a82;
      if (pGVar16->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar15 = Gia_ManAppendObj(p_01);
      uVar20 = *(ulong *)pGVar15;
      *(ulong *)pGVar15 = uVar20 | 0x9fffffff;
      *(ulong *)pGVar15 =
           uVar20 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_01->pObjs;
      if ((pGVar15 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar15)) goto LAB_00704a63;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar15 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_01->pObjs;
      if ((pGVar15 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar15)) goto LAB_00704a63;
      if (iVar1 <= iVar17) goto LAB_00704adf;
      __s[iVar17] = (int)((ulong)((long)pGVar15 - (long)pGVar5) >> 2) * 0x55555556;
      lVar23 = lVar23 + 1;
      pGVar16 = p->pGia;
      pVVar14 = pGVar16->vCis;
    } while (lVar23 < pVVar14->nSize);
  }
  if (p->pPars->fCutMin == 0) {
    Gia_ObjComputeTruthTableStart(pGVar16,p->pPars->nLutSize);
  }
  Gia_ManHashStart(p_01);
  pGVar16 = p->pGia;
  uVar20 = (ulong)(uint)pGVar16->nObjs;
  if (0 < pGVar16->nObjs) {
    local_60 = (ulong)uVar3;
    local_88 = &local_68;
    lVar23 = 0;
    do {
      if (pGVar16->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = pGVar16->pObjs + lVar23;
      uVar6 = *(undefined8 *)pGVar5;
      uVar19 = (uint)uVar6;
      if (((~uVar19 & 0x1fffffff) != 0 && -1 < (int)uVar19) &&
         ((((int)uVar19 < 0 || ((uVar19 & 0x1fffffff) == 0x1fffffff)) ||
          ((uVar19 & 0x1fffffff) != ((uint)((ulong)uVar6 >> 0x20) & 0x1fffffff))))) {
        if ((int)uVar20 <= lVar23) {
LAB_00704a63:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (pGVar16->pRefs[lVar23] != 0) {
          if ((p->vCuts).nSize <= lVar23) goto LAB_00704aa1;
          uVar19 = (p->vCuts).pArray[lVar23];
          pwVar7 = (p->pMem).pPages[(int)uVar19 >> ((byte)(p->pMem).nPageSize & 0x1f)];
          lVar24 = (long)(int)(uVar19 & (p->pMem).uPageMask);
          if (p->pPars->fCutMin == 0) {
            p_00->nSize = 0;
            if ((*(byte *)((long)pwVar7 + lVar24 * 8 + 4) & 0xf) != 0) {
              uVar20 = 0;
              do {
                uVar19 = *(uint *)((long)pwVar7 + uVar20 * 4 + lVar24 * 8 + 8);
                if (uVar19 == 0) break;
                if ((int)uVar19 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf2,"int Abc_Lit2Var(int)");
                }
                Vec_IntPush(p_00,uVar19 >> 1);
                uVar20 = uVar20 + 1;
              } while (uVar20 < (*(uint *)((long)pwVar7 + lVar24 * 8 + 4) & 0xf));
            }
            local_88 = Gia_ObjComputeTruthTableCut(p->pGia,pGVar5,p_00);
LAB_0070484d:
            p_00->nSize = 0;
            if ((*(byte *)((long)pwVar7 + lVar24 * 8 + 4) & 0xf) != 0) {
              uVar20 = 0;
              do {
                uVar19 = *(uint *)((long)pwVar7 + uVar20 * 4 + lVar24 * 8 + 8);
                if (uVar19 == 0) break;
                if ((int)uVar19 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf8,"int Abc_Lit2LitL(int *, int)");
                }
                uVar22 = *(uint *)(*(long *)(__ptr + 2) + (ulong)(uVar19 >> 1) * 4);
                if ((int)uVar22 < 0) goto LAB_00704ac0;
                Vec_IntPush(p_00,uVar22 ^ uVar19 & 1);
                uVar20 = uVar20 + 1;
              } while (uVar20 < (*(uint *)((long)pwVar7 + lVar24 * 8 + 4) & 0xf));
            }
            uVar22 = Dsm_ManTruthToGia(p_01,local_88,p_00,vCover);
            if (p->pPars->fCutMin == 0) {
              uVar19 = 0;
            }
            else {
              uVar19 = *(uint *)((long)pwVar7 + lVar24 * 8 + 4) >> 8 & 1;
            }
            if ((int)uVar22 < 0) goto LAB_00704ac0;
            if (__ptr[1] <= lVar23) goto LAB_00704adf;
            uVar19 = uVar19 ^ uVar22;
LAB_00704905:
            lVar24 = *(long *)(__ptr + 2);
          }
          else {
            uVar19 = *(uint *)((long)pwVar7 + lVar24 * 8 + 4);
            uVar22 = uVar19 >> 9;
            if ((uVar19 & 0xf) != 1) {
              if ((uVar19 & 0xf) != 0) {
                if (p->pPars->fFuncDsd == 0) {
                  pVVar8 = p->vTtMem;
                  if (pVVar8->nEntries <= (int)uVar22) {
                    __assert_fail("i >= 0 && i < p->nEntries",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                                  ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                  }
                  local_88 = local_58;
                  if (0 < (int)uVar3) {
                    uVar19 = pVVar8->PageMask;
                    iVar1 = pVVar8->nEntrySize;
                    pwVar9 = pVVar8->ppPages[uVar22 >> ((byte)pVVar8->LogPageSze & 0x1f)];
                    uVar20 = 0;
                    do {
                      local_58[uVar20] = pwVar9[(long)(int)((uVar19 & uVar22) * iVar1) + uVar20];
                      uVar20 = uVar20 + 1;
                    } while (local_60 != uVar20);
                    local_88 = local_58;
                  }
                }
                else {
                  local_68 = Sdm_ManReadDsdTruth(p->pDsd,uVar22);
                }
                if ((p->pDsd != (Sdm_Man_t *)0x0) &&
                   (uVar19 = Sdm_ManReadDsdVarNum(p->pDsd,uVar22),
                   uVar19 != (*(uint *)((long)pwVar7 + lVar24 * 8 + 4) & 0xf))) {
                  __assert_fail("p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut)"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                                ,0x65d,"Gia_Man_t *Jf_ManDeriveGia(Jf_Man_t *)");
                }
                goto LAB_0070484d;
              }
              if (0x1ff < uVar19) {
                __assert_fail("Class == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                              ,0x64d,"Gia_Man_t *Jf_ManDeriveGia(Jf_Man_t *)");
              }
              if (lVar23 < __ptr[1]) {
                uVar19 = uVar19 >> 8;
                goto LAB_00704905;
              }
              goto LAB_00704adf;
            }
            if (uVar22 != 1) {
              __assert_fail("Class == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                            ,0x653,"Gia_Man_t *Jf_ManDeriveGia(Jf_Man_t *)");
            }
            uVar22 = (uint)pwVar7[lVar24 + 1];
            if ((int)uVar22 < 0) goto LAB_00704ac0;
            lVar24 = *(long *)(__ptr + 2);
            uVar2 = *(uint *)(lVar24 + (ulong)(uVar22 >> 1) * 4);
            if ((int)uVar2 < 0) goto LAB_00704ac0;
            if (__ptr[1] <= lVar23) goto LAB_00704adf;
            uVar19 = uVar2 ^ (uVar22 ^ uVar19 >> 8) & 1;
          }
          *(uint *)(lVar24 + lVar23 * 4) = uVar19;
        }
      }
      lVar23 = lVar23 + 1;
      pGVar16 = p->pGia;
      uVar20 = (ulong)pGVar16->nObjs;
    } while (lVar23 < (long)uVar20);
  }
  pGVar16 = p->pGia;
  pVVar14 = pGVar16->vCos;
  if (0 < pVVar14->nSize) {
    lVar23 = 0;
    do {
      iVar1 = pVVar14->pArray[lVar23];
      if (((long)iVar1 < 0) || (pGVar16->nObjs <= iVar1)) {
LAB_00704a82:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar16->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(uint *)(pGVar16->pObjs + iVar1);
      uVar19 = iVar1 - (uVar3 & 0x1fffffff);
      if (((int)uVar19 < 0) || (__ptr[1] <= (int)uVar19)) {
LAB_00704aa1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar19 = *(uint *)(*(long *)(__ptr + 2) + (ulong)uVar19 * 4);
      if ((int)uVar19 < 0) {
LAB_00704ac0:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_01,uVar19 ^ uVar3 >> 0x1d & 1);
      lVar23 = lVar23 + 1;
      pGVar16 = p->pGia;
      pVVar14 = pGVar16->vCos;
    } while (lVar23 < pVVar14->nSize);
  }
  if (p->pPars->fCutMin == 0) {
    Gia_ObjComputeTruthTableStop(pGVar16);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
    vCover->pArray = (int *)0x0;
  }
  free(vCover);
  Gia_ManHashStop(p_01);
  Gia_ManSetRegNum(p_01,p->pGia->nRegs);
  pGVar16 = p_01;
  if (p->pPars->fCutMin == 0) {
    pGVar16 = Gia_ManCleanup(p_01);
    Gia_ManStop(p_01);
  }
  return pGVar16;
}

Assistant:

Gia_Man_t * Jf_ManDeriveGia( Jf_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    int i, k, iLit, Class, * pCut;
    int nWords = Abc_Truth6WordNum(p->pPars->nLutSize);
    word uTruth = 0, * pTruth = &uTruth, Truth[JF_WORD_MAX];
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    pNew->vLevels = Vec_IntStart( 6*Gia_ManObjNum(p->pGia)/5 + 100 );
    // map primary inputs
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachCi( p->pGia, pObj, i )
        Vec_IntWriteEntry( vCopies, Gia_ObjId(p->pGia, pObj), Gia_ManAppendCi(pNew) );
    // iterate through nodes used in the mapping
    if ( !p->pPars->fCutMin )
        Gia_ObjComputeTruthTableStart( p->pGia, p->pPars->nLutSize );
    Gia_ManHashStart( pNew );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
       if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Jf_ObjCutBest( p, i );
//        printf( "Best cut of node %d:  ", i );  Jf_CutPrint(pCut);
        // get the truth table
        if ( p->pPars->fCutMin )
        {
            Class = Jf_CutFuncClass( pCut );
            if ( Jf_CutSize(pCut) == 0 )
            {
                assert( Class == 0 );
                Vec_IntWriteEntry( vCopies, i, Jf_CutFunc(pCut) );
                continue;
            }
            if ( Jf_CutSize(pCut) == 1 )
            {
                assert( Class == 1 );
                iLit = Abc_LitNotCond( Jf_CutLit(pCut, 1) , Jf_CutFuncCompl(pCut) );
                iLit = Abc_Lit2LitL( Vec_IntArray(vCopies), iLit );
                Vec_IntWriteEntry( vCopies, i, iLit );
                continue;
            }
            if ( p->pPars->fFuncDsd )
                uTruth = Sdm_ManReadDsdTruth(p->pDsd, Class);
            else
                Abc_TtCopy( (pTruth = Truth), Vec_MemReadEntry(p->vTtMem, Class), nWords, 0 );
            assert( p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut) );
        }
        else
        {
            Vec_IntClear( vLeaves );
            Jf_CutForEachLit( pCut, iLit, k )
                Vec_IntPush( vLeaves, Abc_Lit2Var(iLit) );
            pTruth = Gia_ObjComputeTruthTableCut( p->pGia, pObj, vLeaves );
        }
        // collect incoming literals
        Vec_IntClear( vLeaves );
        Jf_CutForEachLit( pCut, iLit, k )
            Vec_IntPush( vLeaves, Abc_Lit2LitL(Vec_IntArray(vCopies), iLit) );
        // create GIA
        iLit = Dsm_ManTruthToGia( pNew, pTruth, vLeaves, vCover );
        iLit = Abc_LitNotCond( iLit, (p->pPars->fCutMin && Jf_CutFuncCompl(pCut)) );
        Vec_IntWriteEntry( vCopies, i, iLit );
    }
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
        Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
    }
    if ( !p->pPars->fCutMin )
        Gia_ObjComputeTruthTableStop( p->pGia );
    Vec_IntFree( vCopies );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCover );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
//    Dsm_ManReportStats();
    // perform cleanup
    if ( !p->pPars->fCutMin )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    return pNew;
}